

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementsTable.cpp
# Opt level: O1

int __thiscall OpenMD::ElementsTable::GetMaxBonds(ElementsTable *this,int atomicnum)

{
  pointer ppEVar1;
  int iVar2;
  
  if (this->init_ == false) {
    Init(this);
  }
  iVar2 = 0;
  if ((-1 < atomicnum) &&
     (ppEVar1 = (this->elements_).
                super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>._M_impl.
                super__Vector_impl_data._M_start, iVar2 = 0,
     atomicnum <
     (int)((ulong)((long)(this->elements_).
                         super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1) >> 3))) {
    iVar2 = ppEVar1[(uint)atomicnum]->maxbonds_;
  }
  return iVar2;
}

Assistant:

int ElementsTable::GetMaxBonds(int atomicnum) {
    if (!init_) Init();

    if (atomicnum < 0 || atomicnum >= static_cast<int>(elements_.size()))
      return (0);

    return (elements_[atomicnum]->GetMaxBonds());
  }